

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O0

QPushButton * __thiscall
QDialogButtonBoxPrivate::createButton
          (QDialogButtonBoxPrivate *this,StandardButton sbutton,LayoutRule layoutRule)

{
  int iVar1;
  QDialogButtonBox *pQVar2;
  QKeySequence *pQVar3;
  QPlatformTheme *pQVar4;
  QStyle *value;
  QStyle *pQVar5;
  ulong uVar6;
  StandardButton in_ESI;
  QDialogButtonBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  ButtonRole role;
  QStyle *style;
  int icon;
  QDialogButtonBox *q;
  QKeySequence standardShortcut;
  QPushButton *button;
  QWidget *in_stack_ffffffffffffff28;
  QWidget *in_stack_ffffffffffffff30;
  QKeySequence *in_stack_ffffffffffffff38;
  QStyle *style_00;
  undefined4 in_stack_ffffffffffffff60;
  int iVar7;
  undefined8 in_stack_ffffffffffffff80;
  AddRule addRule;
  undefined8 in_stack_ffffffffffffff88;
  QAbstractButton *in_stack_ffffffffffffff90;
  QDialogButtonBoxPrivate *in_stack_ffffffffffffff98;
  QIcon local_50;
  undefined1 local_48 [24];
  QKeySequence *local_30;
  StandardButton local_24;
  long local_8;
  
  addRule = (AddRule)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = in_ESI;
  pQVar2 = q_func(in_RDI);
  iVar7 = 0;
  if (local_24 == NoButton) {
    pQVar3 = (QKeySequence *)0x0;
  }
  else {
    if (local_24 == FirstButton) {
      iVar7 = 0x27;
    }
    else if (local_24 == Save) {
      iVar7 = 0x2b;
    }
    else if (local_24 == SaveAll) {
      iVar7 = 0x49;
    }
    else if (local_24 == Open) {
      iVar7 = 0x2a;
    }
    else if (local_24 == Yes) {
      iVar7 = 0x30;
    }
    else if (local_24 == YesToAll) {
      iVar7 = 0x47;
    }
    else if (local_24 == No) {
      iVar7 = 0x31;
    }
    else if (local_24 == NoToAll) {
      iVar7 = 0x48;
    }
    else if (local_24 == Abort) {
      iVar7 = 0x4a;
    }
    else if (local_24 == Retry) {
      iVar7 = 0x4b;
    }
    else if (local_24 == Ignore) {
      iVar7 = 0x4c;
    }
    else if (local_24 == Close) {
      iVar7 = 0x2c;
    }
    else if (local_24 == Cancel) {
      iVar7 = 0x28;
    }
    else if (local_24 == Discard) {
      iVar7 = 0x2f;
    }
    else if (local_24 == Help) {
      iVar7 = 0x29;
    }
    else if (local_24 == Apply) {
      iVar7 = 0x2d;
    }
    else if (local_24 == Reset) {
      iVar7 = 0x2e;
    }
    else if (local_24 == LastButton) {
      iVar7 = 0x4d;
    }
    pQVar3 = (QKeySequence *)operator_new(0x28);
    pQVar4 = QGuiApplicationPrivate::platformTheme();
    (**(code **)(*(long *)pQVar4 + 0x88))(local_48,pQVar4,local_24);
    QPushButton::QPushButton
              ((QPushButton *)pQVar3,(QString *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30)
    ;
    QString::~QString((QString *)0x66c82d);
    local_30 = pQVar3;
    value = QWidget::style(in_stack_ffffffffffffff28);
    iVar1 = (**(code **)(*(long *)value + 0xf0))(value,0x47,0,pQVar2);
    if ((iVar1 != 0) && (iVar7 != 0)) {
      in_stack_ffffffffffffff38 = local_30;
      (**(code **)(*(long *)value + 0x100))(&local_50,value,iVar7,0,pQVar2);
      QAbstractButton::setIcon((QAbstractButton *)pQVar3,(QIcon *)in_stack_ffffffffffffff38);
      QIcon::~QIcon(&local_50);
    }
    style_00 = value;
    pQVar5 = QApplication::style();
    if (value != pQVar5) {
      QWidget::setStyle((QWidget *)CONCAT44(iVar7,in_stack_ffffffffffffff60),style_00);
    }
    QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
    ::insert((QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
              *)pQVar3,(QPushButton **)in_stack_ffffffffffffff38,(StandardButton *)value);
    iVar1 = (int)((ulong)value >> 0x20);
    iVar7 = QPlatformDialogHelper::buttonRole(local_24);
    if (iVar7 == -1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)pQVar3,(char *)in_stack_ffffffffffffff38,iVar1,
                 (char *)in_stack_ffffffffffffff28);
      QMessageLogger::warning
                (&stack0xffffffffffffff90,
                 "QDialogButtonBox::createButton: Invalid ButtonRole, button not added");
    }
    else {
      addButton(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                (ButtonRole)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                (LayoutRule)in_stack_ffffffffffffff88,addRule);
    }
    pQVar4 = QGuiApplicationPrivate::platformTheme();
    (**(code **)(*(long *)pQVar4 + 0x90))(&stack0xffffffffffffff88,pQVar4,local_24);
    uVar6 = QKeySequence::isEmpty();
    if ((uVar6 & 1) == 0) {
      QAbstractButton::setShortcut((QAbstractButton *)pQVar3,in_stack_ffffffffffffff38);
    }
    pQVar3 = local_30;
    QKeySequence::~QKeySequence((QKeySequence *)&stack0xffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QPushButton *)pQVar3;
}

Assistant:

QPushButton *QDialogButtonBoxPrivate::createButton(QDialogButtonBox::StandardButton sbutton,
                                                   LayoutRule layoutRule)
{
    Q_Q(QDialogButtonBox);
    int icon = 0;

    switch (sbutton) {
    case QDialogButtonBox::Ok:
        icon = QStyle::SP_DialogOkButton;
        break;
    case QDialogButtonBox::Save:
        icon = QStyle::SP_DialogSaveButton;
        break;
    case QDialogButtonBox::Open:
        icon = QStyle::SP_DialogOpenButton;
        break;
    case QDialogButtonBox::Cancel:
        icon = QStyle::SP_DialogCancelButton;
        break;
    case QDialogButtonBox::Close:
        icon = QStyle::SP_DialogCloseButton;
        break;
    case QDialogButtonBox::Apply:
        icon = QStyle::SP_DialogApplyButton;
        break;
    case QDialogButtonBox::Reset:
        icon = QStyle::SP_DialogResetButton;
        break;
    case QDialogButtonBox::Help:
        icon = QStyle::SP_DialogHelpButton;
        break;
    case QDialogButtonBox::Discard:
        icon = QStyle::SP_DialogDiscardButton;
        break;
    case QDialogButtonBox::Yes:
        icon = QStyle::SP_DialogYesButton;
        break;
    case QDialogButtonBox::No:
        icon = QStyle::SP_DialogNoButton;
        break;
    case QDialogButtonBox::YesToAll:
        icon = QStyle::SP_DialogYesToAllButton;
        break;
    case QDialogButtonBox::NoToAll:
        icon = QStyle::SP_DialogNoToAllButton;
        break;
    case QDialogButtonBox::SaveAll:
        icon = QStyle::SP_DialogSaveAllButton;
        break;
    case QDialogButtonBox::Abort:
        icon = QStyle::SP_DialogAbortButton;
        break;
    case QDialogButtonBox::Retry:
        icon = QStyle::SP_DialogRetryButton;
        break;
    case QDialogButtonBox::Ignore:
        icon = QStyle::SP_DialogIgnoreButton;
        break;
    case QDialogButtonBox::RestoreDefaults:
        icon = QStyle::SP_RestoreDefaultsButton;
        break;
    case QDialogButtonBox::NoButton:
        return nullptr;
        ;
    }
    QPushButton *button = new QPushButton(QGuiApplicationPrivate::platformTheme()->standardButtonText(sbutton), q);
    QStyle *style = q->style();
    if (style->styleHint(QStyle::SH_DialogButtonBox_ButtonsHaveIcons, nullptr, q) && icon != 0)
        button->setIcon(style->standardIcon(QStyle::StandardPixmap(icon), nullptr, q));
    if (style != QApplication::style()) // Propagate style
        button->setStyle(style);
    standardButtonMap.insert(button, sbutton);
    QPlatformDialogHelper::ButtonRole role = QPlatformDialogHelper::buttonRole(static_cast<QPlatformDialogHelper::StandardButton>(sbutton));
    if (Q_UNLIKELY(role == QPlatformDialogHelper::InvalidRole))
        qWarning("QDialogButtonBox::createButton: Invalid ButtonRole, button not added");
    else
        addButton(button, static_cast<QDialogButtonBox::ButtonRole>(role), layoutRule);
#if QT_CONFIG(shortcut)
    const QKeySequence standardShortcut = QGuiApplicationPrivate::platformTheme()->standardButtonShortcut(sbutton);
    if (!standardShortcut.isEmpty())
        button->setShortcut(standardShortcut);
#endif
    return button;
}